

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  bool bVar1;
  long lVar2;
  allocator local_71;
  string doubleDash;
  string local_50;
  
  std::__cxx11::string::string((string *)&doubleDash,"--",&local_71);
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    bVar1 = std::operator!=(argv[lVar2],&doubleDash);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&local_50,argv[lVar2],&local_71);
    parseIntoTokens(this,&local_50,tokens);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&doubleDash);
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            const std::string doubleDash = "--";
            for( int i = 1; i < argc && argv[i] != doubleDash; ++i )
                parseIntoTokens( argv[i] , tokens);
        }